

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

unsigned_long getDebugLevel(char *variableName,unsigned_long defaultDebugLevel)

{
  int *piVar1;
  char *pcVar2;
  unsigned_long debugLevel;
  char *afterValue;
  char *value;
  char *valueOrNull;
  unsigned_long defaultDebugLevel_local;
  char *variableName_local;
  
  valueOrNull = (char *)defaultDebugLevel;
  defaultDebugLevel_local = (unsigned_long)variableName;
  afterValue = getenv(variableName);
  if (afterValue == (char *)0x0) {
    variableName_local = valueOrNull;
  }
  else {
    value = afterValue;
    piVar1 = __errno_location();
    *piVar1 = 0;
    debugLevel = (unsigned_long)afterValue;
    pcVar2 = (char *)strtoul(afterValue,(char **)&debugLevel,10);
    piVar1 = __errno_location();
    if ((*piVar1 != 0) || (variableName_local = pcVar2, *(char *)debugLevel != '\0')) {
      piVar1 = __errno_location();
      *piVar1 = 0;
      variableName_local = valueOrNull;
    }
  }
  return (unsigned_long)variableName_local;
}

Assistant:

static unsigned long
getDebugLevel(const char *variableName, unsigned long defaultDebugLevel) {
  const char *const valueOrNull = getenv(variableName);
  if (valueOrNull == NULL) {
    return defaultDebugLevel;
  }
  const char *const value = valueOrNull;

  errno = 0;
  char *afterValue = (char *)value;
  unsigned long debugLevel = strtoul(value, &afterValue, 10);
  if ((errno != 0) || (afterValue[0] != '\0')) {
    errno = 0;
    return defaultDebugLevel;
  }

  return debugLevel;
}